

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Boost::render(V2Boost *this,StereoSample *buf,int nsamples)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (this->enabled == true) {
    lVar1 = 0;
    do {
      fVar8 = this->x1[lVar1];
      fVar9 = this->x2[lVar1];
      fVar7 = this->y1[lVar1];
      fVar5 = this->y2[lVar1];
      if (0 < nsamples) {
        uVar2 = 0;
        fVar4 = fVar5;
        fVar6 = fVar9;
        do {
          fVar5 = fVar7;
          fVar9 = fVar8;
          fVar8 = buf[uVar2].field_0.l + 3.8146973e-06;
          fVar7 = ((fVar6 * this->b2 + this->b0 * fVar8 + this->b1 * fVar9) - this->a1 * fVar5) -
                  fVar4 * this->a2;
          buf[uVar2].field_0.l = fVar7;
          uVar2 = uVar2 + 1;
          fVar4 = fVar5;
          fVar6 = fVar9;
        } while ((uint)nsamples != uVar2);
      }
      this->x1[lVar1] = fVar8;
      this->x2[lVar1] = fVar9;
      this->y1[lVar1] = fVar7;
      this->y2[lVar1] = fVar5;
      buf = (StereoSample *)&(buf->field_0).r;
      bVar3 = lVar1 == 0;
      lVar1 = lVar1 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void render(StereoSample *buf, int nsamples)
    {
        if (!enabled)
            return;

        COVER("BOOST render");

        for (int ch=0; ch < 2; ch++)
        {
            float xm1 = x1[ch], xm2 = x2[ch];
            float ym1 = y1[ch], ym2 = y2[ch];

            for (int i=0; i < nsamples; i++)
            {
                float x = buf[i].ch[ch] + fcdcoffset;

                // Second-order IIR filter
                float y = b0*x + b1*xm1 + b2*xm2 - a1*ym1 - a2*ym2;
                ym2 = ym1; ym1 = y;
                xm2 = xm1; xm1 = x;

                buf[i].ch[ch] = y;
            }

            x1[ch] = xm1; x2[ch] = xm2;
            y1[ch] = ym1; y2[ch] = ym2;
        }
    }